

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteCommandType(BinaryWriterSpec *this,Command *command)

{
  Command *command_local;
  BinaryWriterSpec *this_local;
  
  WriteKey(this,"type");
  if (WriteCommandType::s_command_names[(int)command->type] != (char *)0x0) {
    WriteString(this,WriteCommandType::s_command_names[(int)command->type]);
    return;
  }
  __assert_fail("s_command_names[static_cast<size_t>(command.type)]",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-writer-spec.cc"
                ,0x90,
                "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteCommandType(const Command &)"
               );
}

Assistant:

void BinaryWriterSpec::WriteCommandType(const Command& command) {
  static const char* s_command_names[] = {
      "module",
      "module",
      "action",
      "register",
      "assert_malformed",
      "assert_invalid",
      "assert_unlinkable",
      "assert_uninstantiable",
      "assert_return",
      "assert_trap",
      "assert_exhaustion",
      "assert_exception",
  };
  WABT_STATIC_ASSERT(WABT_ARRAY_SIZE(s_command_names) == kCommandTypeCount);

  WriteKey("type");
  assert(s_command_names[static_cast<size_t>(command.type)]);
  WriteString(s_command_names[static_cast<size_t>(command.type)]);
}